

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * Pathie::Path::make_tempname(string *__return_storage_ptr__,string *namepart)

{
  __pid_t _Var1;
  int iVar2;
  tm *__tp;
  long lVar3;
  char buf [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string randompart;
  string pidpart;
  string timepart;
  time_t now;
  stringstream ss;
  ostream local_198 [376];
  
  time(&now);
  __tp = localtime(&now);
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  strftime(buf,0x10,"%Y%m%d-%H%M%S",__tp);
  timepart._M_dataplus._M_p = (pointer)&timepart.field_2;
  timepart.field_2._0_1_ = buf[0];
  timepart.field_2._1_1_ = buf[1];
  timepart.field_2._2_1_ = buf[2];
  timepart.field_2._3_1_ = buf[3];
  timepart.field_2._4_1_ = buf[4];
  timepart.field_2._5_1_ = buf[5];
  timepart.field_2._6_1_ = buf[6];
  timepart.field_2._M_local_buf[7] = buf[7];
  timepart.field_2._8_1_ = buf[8];
  timepart.field_2._9_1_ = buf[9];
  timepart.field_2._10_1_ = buf[10];
  timepart.field_2._11_1_ = buf[0xb];
  timepart.field_2._12_1_ = buf[0xc];
  timepart.field_2._13_1_ = buf[0xd];
  timepart.field_2._14_1_ = buf[0xe];
  timepart._M_string_length = 0xf;
  timepart.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  _Var1 = getpid();
  std::ostream::operator<<(local_198,_Var1);
  std::__cxx11::stringbuf::str();
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    iVar2 = rand();
    buf[lVar3] = (char)(iVar2 % 0x1a) + 'a';
  }
  randompart._M_dataplus._M_p = (pointer)&randompart.field_2;
  randompart.field_2._0_1_ = buf[0];
  randompart.field_2._1_1_ = buf[1];
  randompart.field_2._2_1_ = buf[2];
  randompart.field_2._3_1_ = buf[3];
  randompart.field_2._4_1_ = buf[4];
  randompart.field_2._5_1_ = buf[5];
  randompart.field_2._6_1_ = buf[6];
  randompart.field_2._M_local_buf[7] = buf[7];
  randompart.field_2._8_1_ = buf[8];
  randompart.field_2._9_1_ = buf[9];
  randompart.field_2._10_1_ = buf[10];
  randompart.field_2._11_1_ = buf[0xb];
  randompart.field_2._12_1_ = buf[0xc];
  randompart.field_2._13_1_ = buf[0xd];
  randompart.field_2._14_1_ = buf[0xe];
  randompart._M_string_length = 0xf;
  randompart.field_2._M_local_buf[0xf] = '\0';
  std::operator+(&local_270,namepart,"_");
  std::operator+(&local_250,&local_270,&timepart);
  std::operator+(&local_230,&local_250,&pidpart);
  std::operator+(__return_storage_ptr__,&local_230,&randompart);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string Path::make_tempname(const std::string& namepart)
{
  time_t now;
  struct tm* p_nowinfo = NULL;
  time(&now);
  p_nowinfo = localtime(&now);

  char buf[16]; // 15 + NUL
  memset(buf, '\0', 16);
  strftime(buf, 16, "%Y%m%d-%H%M%S", p_nowinfo);
  std::string timepart(buf, 15);

#if defined(_PATHIE_UNIX)
  std::stringstream ss;
  ss << getpid();
  std::string pidpart = ss.str();
#elif defined(_WIN32)
  std::stringstream ss;
  ss << GetCurrentProcessId();
  std::string pidpart = ss.str();
#else
#error Unsupported system.
#endif

  memset(buf, '\0', 16);
  short i;
  for(i=0; i < 16; i++)
    buf[i] = 97 + rand() % 26; // Random char between a and z

  std::string randompart(buf, 15);

  return namepart + "_" + timepart + pidpart + randompart;
}